

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libxml_reporter.c
# Opt level: O0

void xml_reporter_finish_suite(TestReporter *reporter,char *filename,int line)

{
  undefined8 *puVar1;
  int iVar2;
  long in_RDI;
  xml_suite_context *ctx;
  XmlMemo_conflict *memo;
  char *in_stack_ffffffffffffffc8;
  char *format;
  undefined7 in_stack_ffffffffffffffd0;
  undefined1 in_stack_ffffffffffffffd7;
  undefined1 uVar3;
  
  puVar1 = *(undefined8 **)(in_RDI + 0x88);
  iVar2 = context_stack_p + -1;
  reporter_finish_suite
            ((TestReporter *)CONCAT17(in_stack_ffffffffffffffd7,in_stack_ffffffffffffffd0),
             in_stack_ffffffffffffffc8,0);
  *(int *)(in_RDI + 100) = *(int *)(in_RDI + 100) + *(int *)(in_RDI + 0x50);
  *(int *)(in_RDI + 0x68) = *(int *)(in_RDI + 0x68) + *(int *)(in_RDI + 0x54);
  *(int *)(in_RDI + 0x70) = *(int *)(in_RDI + 0x70) + *(int *)(in_RDI + 0x5c);
  *(int *)(in_RDI + 0x6c) = *(int *)(in_RDI + 0x6c) + *(int *)(in_RDI + 0x58);
  format = "%d";
  uVar3 = 0;
  xmlFormatProp(context_stack[iVar2].suite,(xmlChar *)"failures","%d",
                (ulong)*(uint *)(in_RDI + 0x54));
  xmlFormatProp(context_stack[iVar2].suite,(xmlChar *)"errors",format,
                (ulong)*(uint *)(in_RDI + 0x58));
  xmlFormatProp(context_stack[iVar2].suite,(xmlChar *)"skipped",format,
                (ulong)*(uint *)(in_RDI + 0x5c));
  xmlFormatProp((xmlNodePtr)((double)context_stack[iVar2].suite_duration / 1000.0),
                (xmlChar *)context_stack[iVar2].suite,"time","%.5f");
  deleteEmpty((xmlNodePtr)CONCAT17(uVar3,in_stack_ffffffffffffffd0));
  (*(code *)*puVar1)(context_stack[iVar2].doc);
  xmlFreeDoc(context_stack[iVar2].doc);
  if (1 < context_stack_p) {
    context_stack[context_stack_p + -2].suite_duration =
         context_stack[iVar2].suite_duration + context_stack[context_stack_p + -2].suite_duration;
  }
  context_stack_p = context_stack_p + -1;
  return;
}

Assistant:

static void xml_reporter_finish_suite(TestReporter *reporter, const char *filename, int line) {
    XmlMemo *memo = (XmlMemo *)reporter->memo;
    struct xml_suite_context *ctx = &context_stack[context_stack_p-1];

    reporter_finish_suite(reporter, filename, line);

    reporter->total_passes += reporter->passes;
    reporter->total_failures += reporter->failures;
    reporter->total_skips += reporter->skips;
    reporter->total_exceptions += reporter->exceptions;

    xmlFormatProp(ctx->suite, XMLSTRING("failures"), "%d", reporter->failures);
    xmlFormatProp(ctx->suite, XMLSTRING("errors"), "%d", reporter->exceptions);
    xmlFormatProp(ctx->suite, XMLSTRING("skipped"), "%d", reporter->skips);
    xmlFormatProp(ctx->suite, XMLSTRING("time"), "%.5f", (double)ctx->suite_duration/(double)1000);

    deleteEmpty(ctx->suite);
    memo->printer(ctx->doc);
    xmlFreeDoc(ctx->doc);
    if (context_stack_p > 1) {
        context_stack[context_stack_p-2].suite_duration += ctx->suite_duration;
    }
    --context_stack_p;
}